

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

CommandQueueVkImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator>::operator()
          (MakeNewRCObj<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator> *this,
          shared_ptr<VulkanUtilities::VulkanLogicalDevice> *CtorArgs,
          IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *CtorArgs_1,uint *CtorArgs_2
          ,uint *CtorArgs_3,ImmediateContextCreateInfo *CtorArgs_4)

{
  undefined8 *puVar1;
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  RefCountersImpl *pRefCounters;
  CommandQueueVkImpl *this_00;
  RefCountersImpl *local_90;
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    pRefCounters = (RefCountersImpl *)::operator_new(0x30);
    (pRefCounters->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_00891840;
    (pRefCounters->m_ObjectState)._M_i = NotInitialized;
    pRefCounters->m_ObjectWrapperBuffer[0] = 0;
    pRefCounters->m_ObjectWrapperBuffer[1] = 0;
    pRefCounters->m_ObjectWrapperBuffer[2] = 0;
    pRefCounters->m_NumStrongReferences = (__atomic_base<int>)0x0;
    pRefCounters->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (pRefCounters->m_Lock).m_IsLocked._M_base._M_i = false;
    local_90 = pRefCounters;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
    local_90 = (RefCountersImpl *)0x0;
  }
  puVar1 = *(undefined8 **)this;
  if (puVar1 == (undefined8 *)0x0) {
    this_00 = (CommandQueueVkImpl *)malloc(0x1d8);
    std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_50,
                 &CtorArgs->
                  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                );
    CommandQueueVkImpl::CommandQueueVkImpl
              (this_00,&pRefCounters->super_IReferenceCounters,
               (shared_ptr<VulkanUtilities::VulkanLogicalDevice> *)&local_50,
               (SoftwareQueueIndex)CtorArgs_1->m_Value,*CtorArgs_2,*CtorArgs_3,CtorArgs_4);
    p_Var2 = &local_50;
  }
  else {
    this_00 = (CommandQueueVkImpl *)(**(code **)*puVar1)(puVar1,0x1d8);
    std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_40,
                 &CtorArgs->
                  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                );
    CommandQueueVkImpl::CommandQueueVkImpl
              (this_00,&pRefCounters->super_IReferenceCounters,
               (shared_ptr<VulkanUtilities::VulkanLogicalDevice> *)&local_40,
               (SoftwareQueueIndex)CtorArgs_1->m_Value,*CtorArgs_2,*CtorArgs_3,CtorArgs_4);
    p_Var2 = &local_40;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  if (local_90 != (RefCountersImpl *)0x0) {
    RefCountersImpl::Attach<Diligent::CommandQueueVkImpl,Diligent::IMemoryAllocator>
              (local_90,this_00,*(IMemoryAllocator **)this);
  }
  return this_00;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }